

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::Init
          (LocationRecorder *this,LocationRecorder *parent,SourceCodeInfo *source_code_info)

{
  RepeatedField<int> *pRVar1;
  int iVar2;
  uint uVar3;
  Rep *pRVar4;
  Location *pLVar5;
  SourceCodeInfo_Location *obj;
  Location *pLVar6;
  int *piVar7;
  int tmp_1;
  int tmp;
  
  this->parser_ = parent->parser_;
  this->source_code_info_ = source_code_info;
  pRVar4 = (source_code_info->location_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar2 = (source_code_info->location_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar2 < pRVar4->allocated_size) {
      (source_code_info->location_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
      pLVar6 = (Location *)pRVar4->elements[iVar2];
      goto LAB_0033997d;
    }
  }
  obj = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo_Location>
                  ((source_code_info->location_).super_RepeatedPtrFieldBase.arena_);
  pLVar6 = (Location *)
           internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(source_code_info->location_).super_RepeatedPtrFieldBase,obj);
LAB_0033997d:
  this->location_ = pLVar6;
  pLVar5 = parent->location_;
  if (pLVar5 != pLVar6) {
    (pLVar6->path_).current_size_ = 0;
    RepeatedField<int>::MergeFrom(&pLVar6->path_,&pLVar5->path_);
    pLVar6 = this->location_;
  }
  iVar2 = (this->parser_->input_->current_).line;
  pRVar1 = &pLVar6->span_;
  uVar3 = (pLVar6->span_).current_size_;
  if (uVar3 == (pLVar6->span_).total_size_) {
    RepeatedField<int>::Reserve(pRVar1,uVar3 + 1);
    piVar7 = RepeatedField<int>::elements(pRVar1);
    piVar7[uVar3] = iVar2;
  }
  else {
    piVar7 = RepeatedField<int>::elements(pRVar1);
    piVar7[uVar3] = iVar2;
  }
  pRVar1->current_size_ = uVar3 + 1;
  pLVar6 = this->location_;
  iVar2 = (this->parser_->input_->current_).column;
  pRVar1 = &pLVar6->span_;
  uVar3 = (pLVar6->span_).current_size_;
  if (uVar3 == (pLVar6->span_).total_size_) {
    RepeatedField<int>::Reserve(pRVar1,uVar3 + 1);
    piVar7 = RepeatedField<int>::elements(pRVar1);
    piVar7[uVar3] = iVar2;
  }
  else {
    piVar7 = RepeatedField<int>::elements(pRVar1);
    piVar7[uVar3] = iVar2;
  }
  pRVar1->current_size_ = uVar3 + 1;
  return;
}

Assistant:

void Parser::LocationRecorder::Init(const LocationRecorder& parent,
                                    SourceCodeInfo* source_code_info) {
  parser_ = parent.parser_;
  source_code_info_ = source_code_info;

  location_ = source_code_info_->add_location();
  location_->mutable_path()->CopyFrom(parent.location_->path());

  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}